

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void nni_pipe_add(nni_pipe *p)

{
  nni_mtx *mtx;
  nni_sock *pnVar1;
  nni_dialer *pnVar2;
  nni_listener *pnVar3;
  
  pnVar1 = p->p_sock;
  pnVar2 = p->p_dialer;
  pnVar3 = p->p_listener;
  mtx = &pnVar1->s_mx;
  nni_mtx_lock(mtx);
  nni_list_append(&pnVar1->s_pipes,p);
  if (pnVar2 != (nni_dialer *)0x0) {
    if (pnVar3 != (nni_listener *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
                0x5ef,"l == NULL");
    }
    nni_list_append(&pnVar2->d_pipes,p);
  }
  if (pnVar3 != (nni_listener *)0x0) {
    if (pnVar2 != (nni_dialer *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
                0x5f3,"d == NULL");
    }
    nni_list_append(&pnVar3->l_pipes,p);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

void
nni_pipe_add(nni_pipe *p)
{
	nni_sock     *s = p->p_sock;
	nni_dialer   *d = p->p_dialer;
	nni_listener *l = p->p_listener;

	nni_mtx_lock(&s->s_mx);
	nni_list_append(&s->s_pipes, p);
	if (d != NULL) {
		NNI_ASSERT(l == NULL);
		nni_list_append(&d->d_pipes, p);
	}
	if (l != NULL) {
		NNI_ASSERT(d == NULL);
		nni_list_append(&l->l_pipes, p);
	}
	nni_mtx_unlock(&s->s_mx);
}